

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pinholecamera.hpp
# Opt level: O3

Ray * __thiscall
PinholeCamera::sampleray(Ray *__return_storage_ptr__,PinholeCamera *this,vec2f pos,Sampler *param_2)

{
  float fVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar5;
  undefined8 uVar4;
  undefined4 uVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  
  fVar7 = (this->super_Camera).position.y;
  fVar1 = (this->super_Camera).position.z;
  fVar9 = 1.0 - (pos.x + pos.x);
  fVar11 = 1.0 - (pos.y + pos.y);
  fVar8 = (this->uphalf).z * fVar11 + *(float *)&this->field_0x44 + (this->lefthalf).z * fVar9;
  uVar2 = (this->lefthalf).x;
  uVar5 = (this->lefthalf).y;
  uVar4 = *(undefined8 *)&(this->super_Camera).field_0x3c;
  uVar3 = (this->uphalf).x;
  uVar6 = (this->uphalf).y;
  fVar10 = fVar11 * (float)uVar3 + (float)uVar4 + fVar9 * (float)uVar2;
  fVar9 = fVar11 * (float)uVar6 + (float)((ulong)uVar4 >> 0x20) + fVar9 * (float)uVar5;
  fVar11 = 1.0 / SQRT(fVar8 * fVar8 + fVar10 * fVar10 + fVar9 * fVar9);
  (__return_storage_ptr__->origin).x = (this->super_Camera).position.x;
  (__return_storage_ptr__->origin).y = fVar7;
  (__return_storage_ptr__->origin).z = fVar1;
  (__return_storage_ptr__->dir).x = fVar11 * fVar10;
  (__return_storage_ptr__->dir).y = fVar11 * fVar9;
  (__return_storage_ptr__->dir).z = fVar8 * fVar11;
  return __return_storage_ptr__;
}

Assistant:

Ray sampleray(vec2f pos, Sampler&) const {
		return Ray(position, normalized(dir + (1-pos.x*2) * lefthalf + (1-pos.y*2) * uphalf));
	}